

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  RsIfElseSyntax *pRVar1;
  Token TVar2;
  Token *unaff_retaddr;
  BumpAllocator *in_stack_00000008;
  RsElseClauseSyntax **in_stack_00000020;
  BumpAllocator *in_stack_000000d8;
  Token *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  RsProdItemSyntax *in_stack_ffffffffffffff90;
  
  TVar2 = parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7a4cc0);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone(in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::RsProdItemSyntax_*>::operator*
            ((not_null<slang::syntax::RsProdItemSyntax_*> *)0x7a4cfd);
  deepClone<slang::syntax::RsProdItemSyntax>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  if (((Token *)((long)__fn + 0x50))->info != (Info *)0x0) {
    deepClone<slang::syntax::RsElseClauseSyntax>
              ((RsElseClauseSyntax *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  }
  pRVar1 = BumpAllocator::
           emplace<slang::syntax::RsIfElseSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::RsProdItemSyntax&,slang::syntax::RsElseClauseSyntax*>
                     (in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (ExpressionSyntax *)__child_stack,(Token *)TVar2.info,TVar2._0_8_,
                      in_stack_00000020);
  return (int)pRVar1;
}

Assistant:

static SyntaxNode* clone(const RsIfElseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<RsIfElseSyntax>(
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.condition, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<RsProdItemSyntax>(*node.ifItem, alloc),
        node.elseClause ? deepClone(*node.elseClause, alloc) : nullptr
    );
}